

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.c
# Opt level: O0

sysbvm_tuple_t
sysbvm_astTupleSlotNamedAtPutNode_primitiveAnalyze
          (sysbvm_context_t *context,sysbvm_tuple_t closure,size_t argumentCount,
          sysbvm_tuple_t *arguments)

{
  _Bool _Var1;
  sysbvm_tuple_t *psVar2;
  sysbvm_tuple_t sVar3;
  sysbvm_tuple_t sVar4;
  undefined1 local_a8 [8];
  sysbvm_stackFrameSourcePositionRecord_t sourcePositionRecord;
  sysbvm_stackFrameGCRootsRecord_t gcFrameRecord;
  anon_struct_56_7_ac49a46d gcFrame;
  sysbvm_tuple_t *environment;
  sysbvm_tuple_t *node;
  sysbvm_tuple_t *arguments_local;
  size_t argumentCount_local;
  sysbvm_tuple_t closure_local;
  sysbvm_context_t *context_local;
  
  if (argumentCount != 2) {
    sysbvm_error_argumentCountMismatch(2,argumentCount);
    sysbvm_error_argumentCountMismatch(2,argumentCount);
  }
  psVar2 = arguments + 1;
  memset(&gcFrameRecord.roots,0,0x38);
  memset(&sourcePositionRecord.sourcePosition,0,0x20);
  gcFrameRecord.previous._0_4_ = 0;
  gcFrameRecord.type = SYSBVM_STACK_FRAME_RECORD_TYPE_LANDING_PAD;
  gcFrameRecord._12_4_ = 0;
  gcFrameRecord.rootCount = (size_t)&gcFrameRecord.roots;
  sysbvm_stackFrame_pushRecord((sysbvm_stackFrameRecord_t *)&sourcePositionRecord.sourcePosition);
  gcFrameRecord.roots = (sysbvm_tuple_t *)sysbvm_context_shallowCopy(context,*arguments);
  sVar3 = sysbvm_analysisAndEvaluationEnvironment_ensureValidAnalyzerToken(context,*psVar2);
  gcFrameRecord.roots[3] = sVar3;
  local_a8 = (undefined1  [8])0x0;
  sourcePositionRecord.previous._0_4_ = 6;
  sourcePositionRecord._8_8_ = gcFrameRecord.roots[2];
  sysbvm_stackFrame_pushRecord((sysbvm_stackFrameRecord_t *)local_a8);
  sVar3 = sysbvm_interpreter_analyzeASTWithReceiverTypeWithEnvironment
                    (context,gcFrameRecord.roots[5],*psVar2);
  gcFrameRecord.roots[5] = sVar3;
  if (gcFrameRecord.roots[6] == 0) {
    if (gcFrameRecord.roots[8] == 0) {
      sysbvm_error("A name or bound slot is required.");
    }
  }
  else {
    sVar4 = sysbvm_interpreter_analyzeASTWithExpectedTypeWithEnvironment
                      (context,gcFrameRecord.roots[6],(context->roots).symbolType,*psVar2);
    gcFrameRecord.roots[6] = sVar4;
    _Var1 = sysbvm_astNode_isLiteralNode(context,sVar4);
    if (!_Var1) {
      sysbvm_error("Expected a literal slot name.");
    }
    sVar4 = sysbvm_astLiteralNode_getValue(sVar4);
    sVar3 = sysbvm_astNode_getAnalyzedType(sVar3);
    if (sVar3 == 0) {
      sysbvm_error_assertionFailure
                (
                "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/lib/sysbvm/interpreter.c:4341: assertion failure: gcFrame.analyzedTupleExpressionType"
                );
    }
    sVar3 = sysbvm_type_lookupSlot(context,sVar3,sVar4);
    if (sVar3 == 0) {
      sysbvm_error("Type does not have a slot with the specified name.");
    }
    gcFrameRecord.roots[8] = sVar3;
  }
  sVar3 = sysbvm_typeSlot_getType(gcFrameRecord.roots[8]);
  gcFrameRecord.roots[4] = sVar3;
  if (gcFrameRecord.roots[4] == 0) {
    gcFrameRecord.roots[4] = (context->roots).anyValueType;
  }
  sVar3 = sysbvm_interpreter_analyzeASTWithExpectedTypeWithEnvironment
                    (context,gcFrameRecord.roots[7],gcFrameRecord.roots[4],*psVar2);
  gcFrameRecord.roots[7] = sVar3;
  sysbvm_stackFrame_popRecord((sysbvm_stackFrameRecord_t *)local_a8);
  sysbvm_stackFrame_popRecord((sysbvm_stackFrameRecord_t *)&sourcePositionRecord.sourcePosition);
  return (sysbvm_tuple_t)gcFrameRecord.roots;
}

Assistant:

static sysbvm_tuple_t sysbvm_astTupleSlotNamedAtPutNode_primitiveAnalyze(sysbvm_context_t *context, sysbvm_tuple_t closure, size_t argumentCount, sysbvm_tuple_t *arguments)
{
    (void)closure;
    if(argumentCount != 2) sysbvm_error_argumentCountMismatch(2, argumentCount);

    (void)closure;
    if(argumentCount != 2) sysbvm_error_argumentCountMismatch(2, argumentCount);

    sysbvm_tuple_t *node = &arguments[0];
    sysbvm_tuple_t *environment = &arguments[1];

    struct {
        sysbvm_astTupleSlotNamedAtPutNode_t *tupleSlotNamedAtPutNode;
        sysbvm_tuple_t analyzedTupleExpression;
        sysbvm_tuple_t analyzedNameExpression;
        sysbvm_tuple_t analyzedTupleExpressionType;
        sysbvm_tuple_t slotName;
        sysbvm_tuple_t slot;
        sysbvm_tuple_t analyzedValueExpression;
    } gcFrame = {0};
    SYSBVM_STACKFRAME_PUSH_GC_ROOTS(gcFrameRecord, gcFrame);
    gcFrame.tupleSlotNamedAtPutNode = (sysbvm_astTupleSlotNamedAtPutNode_t*)sysbvm_context_shallowCopy(context, *node);
    gcFrame.tupleSlotNamedAtPutNode->super.analyzerToken = sysbvm_analysisAndEvaluationEnvironment_ensureValidAnalyzerToken(context, *environment);

    SYSBVM_STACKFRAME_PUSH_SOURCE_POSITION(sourcePositionRecord, gcFrame.tupleSlotNamedAtPutNode->super.sourcePosition);

    gcFrame.analyzedTupleExpression = sysbvm_interpreter_analyzeASTWithReceiverTypeWithEnvironment(context, gcFrame.tupleSlotNamedAtPutNode->tupleExpression, *environment);
    gcFrame.tupleSlotNamedAtPutNode->tupleExpression = gcFrame.analyzedTupleExpression;

    if(gcFrame.tupleSlotNamedAtPutNode->nameExpression)
    {
        gcFrame.analyzedNameExpression = sysbvm_interpreter_analyzeASTWithExpectedTypeWithEnvironment(context, gcFrame.tupleSlotNamedAtPutNode->nameExpression, context->roots.symbolType, *environment);
        gcFrame.tupleSlotNamedAtPutNode->nameExpression = gcFrame.analyzedNameExpression;
        if(!sysbvm_astNode_isLiteralNode(context, gcFrame.analyzedNameExpression))
            sysbvm_error("Expected a literal slot name.");

        gcFrame.slotName = sysbvm_astLiteralNode_getValue(gcFrame.analyzedNameExpression);

        gcFrame.analyzedTupleExpressionType = sysbvm_astNode_getAnalyzedType(gcFrame.analyzedTupleExpression);
        SYSBVM_ASSERT(gcFrame.analyzedTupleExpressionType);

        gcFrame.slot = sysbvm_type_lookupSlot(context, gcFrame.analyzedTupleExpressionType, gcFrame.slotName);
        if(!gcFrame.slot)
            sysbvm_error("Type does not have a slot with the specified name.");

        gcFrame.tupleSlotNamedAtPutNode->boundSlot = gcFrame.slot;
    }
    else
    {
        if(!gcFrame.tupleSlotNamedAtPutNode->boundSlot)
            sysbvm_error("A name or bound slot is required.");
    }

    gcFrame.tupleSlotNamedAtPutNode->super.analyzedType = sysbvm_typeSlot_getType(gcFrame.tupleSlotNamedAtPutNode->boundSlot);
    if(!gcFrame.tupleSlotNamedAtPutNode->super.analyzedType)
        gcFrame.tupleSlotNamedAtPutNode->super.analyzedType = context->roots.anyValueType;

    gcFrame.analyzedValueExpression = sysbvm_interpreter_analyzeASTWithExpectedTypeWithEnvironment(context, gcFrame.tupleSlotNamedAtPutNode->valueExpression, gcFrame.tupleSlotNamedAtPutNode->super.analyzedType, *environment);
    gcFrame.tupleSlotNamedAtPutNode->valueExpression = gcFrame.analyzedValueExpression;

    SYSBVM_STACKFRAME_POP_SOURCE_POSITION(sourcePositionRecord);
    SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
    return (sysbvm_tuple_t)gcFrame.tupleSlotNamedAtPutNode;
}